

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int linklist_5_3::get_common_arr(int *a,int n1,int *b,int n2)

{
  int iVar1;
  sqlist_5_3 *this;
  int *piVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  int iVar5;
  
  iVar4 = n1;
  this = (sqlist_5_3 *)malloc(0x10);
  *(undefined8 *)(this + 8) = 0;
  if ((0 < n1) && (0 < n2)) {
    iVar5 = 0;
    iVar3 = 0;
    do {
      iVar1 = a[iVar5];
      if (iVar1 == b[iVar3]) {
        piVar2 = (int *)malloc(0x10);
        *piVar2 = iVar1;
        *(undefined8 *)(piVar2 + 2) = *(undefined8 *)(this + 8);
        *(int **)(this + 8) = piVar2;
        iVar5 = iVar5 + 1;
LAB_00101fa8:
        iVar3 = iVar3 + 1;
      }
      else {
        if (b[iVar3] <= iVar1) goto LAB_00101fa8;
        iVar5 = iVar5 + 1;
      }
    } while ((iVar5 < n1) && (iVar3 < n2));
  }
  sqlist_5_3::test_1(this,(LinkList)CONCAT44(in_register_00000034,iVar4));
}

Assistant:

int get_common_arr(int *a, int n1, int *b, int n2) {
        int i = 0, j = 0;
        LinkList list = newNode, p, q;
        list->next = nullptr;
        q = list;
        while (i < n1 && j < n2) {
            if (a[i] == b[j]) {
                p = newNode;
                p->data = a[i];
//                q->next = p;
//                q = p;
                p->next = q->next;
                q->next = p;
                i++;
                j++;
            } else if (a[i] < b[j]) {
                i++;
            } else {
                j++;
            }
        }
        ps_link_list(list);
        ps_link_list(q);
    }